

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_shaders.cpp
# Opt level: O3

void gen_phong_shade(float *cl,float *cp,float *l,float *e,float *n,int p,float *clambert)

{
  int i;
  long lVar1;
  float p_1;
  float fVar2;
  vec3 cphong;
  float afStack_40 [6];
  
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + n[lVar1] * l[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    afStack_40[lVar1] = n[lVar1] * (fVar2 + fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    afStack_40[lVar1] = afStack_40[lVar1] - l[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + afStack_40[lVar1] * afStack_40[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    afStack_40[lVar1] = afStack_40[lVar1] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + afStack_40[lVar1] * e[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 <= 0.0) {
    fVar2 = 0.0;
  }
  fVar2 = fast_pow(fVar2,p);
  lVar1 = 0;
  do {
    afStack_40[lVar1 + 3] = cp[lVar1] * fVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  vec3_fraction(afStack_40 + 3,cl,afStack_40 + 3);
  lVar1 = 0;
  do {
    clambert[lVar1] = clambert[lVar1] + afStack_40[lVar1 + 3];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  vec3_cull(clambert);
  return;
}

Assistant:

void gen_phong_shade(const vec3 cl, const vec3 cp, const vec3 l, const vec3 e, const vec3 n, const int p, vec3 clambert){
    //calculate r
    vec3 r;
    vec3_scale( r, n, 2.0f*vec3_mul_inner(l,n) );
    vec3_sub(r, r, l);
    vec3_norm(r,r);

    //calculate shade
    vec3 cphong;
    vec3_scale(cphong, cp, fast_pow(std::max(0.0f,vec3_mul_inner(e,r)),p));
    vec3_fraction(cphong, cl, cphong);
    vec3_add(clambert, clambert, cphong);
    vec3_cull(clambert);
}